

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

bool remap_generic(Compiler *compiler,SmallVector<spirv_cross::Resource,_8UL> *resources,
                  Remap *remap)

{
  TypedID<(spirv_cross::Types)2> TVar1;
  Resource *pRVar2;
  Resource *pRVar3;
  Resource *itr;
  Remap *remap_local;
  SmallVector<spirv_cross::Resource,_8UL> *resources_local;
  Compiler *compiler_local;
  
  pRVar2 = std::begin<spirv_cross::SmallVector<spirv_cross::Resource,8ul>>(resources);
  pRVar3 = std::end<spirv_cross::SmallVector<spirv_cross::Resource,8ul>>(resources);
  pRVar2 = std::
           find_if<spirv_cross::Resource_const*,remap_generic(spirv_cross::Compiler&,spirv_cross::SmallVector<spirv_cross::Resource,8ul>const&,Remap_const&)::__0>
                     (pRVar2,pRVar3,(anon_class_8_1_a88ff569_for__M_pred)remap);
  pRVar3 = std::end<spirv_cross::SmallVector<spirv_cross::Resource,8ul>>(resources);
  if (pRVar2 != pRVar3) {
    TVar1 = spirv_cross::TypedID::operator_cast_to_TypedID((TypedID *)pRVar2);
    spirv_cross::Compiler::set_remapped_variable_state(compiler,(VariableID)TVar1.id,true);
    spirv_cross::Compiler::set_name(compiler,(ID)(pRVar2->id).id,&remap->dst_name);
    TVar1 = spirv_cross::TypedID::operator_cast_to_TypedID((TypedID *)pRVar2);
    spirv_cross::Compiler::set_subpass_input_remapped_components
              (compiler,(VariableID)TVar1.id,remap->components);
  }
  return pRVar2 != pRVar3;
}

Assistant:

static bool remap_generic(Compiler &compiler, const SmallVector<Resource> &resources, const Remap &remap)
{
	auto itr =
	    find_if(begin(resources), end(resources), [&remap](const Resource &res) { return res.name == remap.src_name; });

	if (itr != end(resources))
	{
		compiler.set_remapped_variable_state(itr->id, true);
		compiler.set_name(itr->id, remap.dst_name);
		compiler.set_subpass_input_remapped_components(itr->id, remap.components);
		return true;
	}
	else
		return false;
}